

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O1

QByteArray *
qGssapiContinue(QByteArray *__return_storage_ptr__,QAuthenticatorPrivate *ctx,
               QByteArrayView challenge)

{
  QGssApiHandles *pQVar1;
  QArrayData *pQVar2;
  char *pcVar3;
  qsizetype qVar4;
  OM_uint32 stat;
  uint stat_00;
  long *plVar5;
  long in_FS_OFFSET;
  gss_buffer_desc inBuf;
  OM_uint32 ignored;
  OM_uint32 minStat;
  QByteArray local_78;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  long local_48;
  storage_type *psStack_40;
  undefined4 local_38;
  OM_uint32 local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0xaaaaaaaa;
  local_38 = 0xaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_48 = 0;
  psStack_40 = (storage_type *)0x0;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  if (challenge.m_size == 0) {
    plVar5 = (long *)0x0;
  }
  else {
    plVar5 = &local_48;
    local_48 = challenge.m_size;
    psStack_40 = challenge.m_data;
  }
  pQVar1 = (ctx->gssApiHandles).d;
  stat_00 = gss_init_sec_context
                      (&local_34,0,pQVar1,pQVar1->targetName,0,2,0,0,plVar5,0,&local_58,0,0);
  if (CONCAT44(uStack_54,local_58) != 0) {
    QByteArray::QByteArray
              (&local_78,(char *)CONCAT44(uStack_4c,uStack_50),CONCAT44(uStack_54,local_58));
    pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    *(undefined4 *)&(__return_storage_ptr__->d).d = local_78.d.d._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_78.d.d._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_78.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_78.d.ptr._4_4_;
    qVar4 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_78.d.size;
    local_78.d.d = (Data *)pQVar2;
    local_78.d.ptr = pcVar3;
    local_78.d.size = qVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,1,0x10);
      }
    }
  }
  gss_release_buffer(&local_38,&local_58);
  stat = local_34;
  if (1 < stat_00) {
    q_GSSAPI_error_int("gss_init_sec_context error",stat_00,1);
    q_GSSAPI_error_int("gss_init_sec_context error",stat,2);
    gss_release_name(&local_38,&((ctx->gssApiHandles).d)->targetName);
    pQVar1 = (ctx->gssApiHandles).d;
    if (pQVar1->gssCtx != (gss_ctx_id_t)0x0) {
      gss_delete_sec_context(&local_38,pQVar1,0);
    }
    pQVar1 = (ctx->gssApiHandles).d;
    if (pQVar1 != (QGssApiHandles *)0x0) {
      (ctx->gssApiHandles).d = (QGssApiHandles *)0x0;
      operator_delete(pQVar1,0x10);
    }
  }
  if (stat_00 == 0) {
    gss_release_name(&local_38,&((ctx->gssApiHandles).d)->targetName);
    pQVar1 = (ctx->gssApiHandles).d;
    if (pQVar1 != (QGssApiHandles *)0x0) {
      (ctx->gssApiHandles).d = (QGssApiHandles *)0x0;
      operator_delete(pQVar1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray qGssapiContinue(QAuthenticatorPrivate *ctx, QByteArrayView challenge)
{
    OM_uint32 majStat, minStat, ignored;
    QByteArray result;
    gss_buffer_desc inBuf = {0, nullptr}; // GSS input token
    gss_buffer_desc outBuf; // GSS output token

    if (!challenge.isEmpty()) {
        inBuf.value = const_cast<char*>(challenge.data());
        inBuf.length = challenge.size();
    }

    majStat = gss_init_sec_context(&minStat,
                                   GSS_C_NO_CREDENTIAL,
                                   &ctx->gssApiHandles->gssCtx,
                                   ctx->gssApiHandles->targetName,
                                   GSS_C_NO_OID,
                                   GSS_C_MUTUAL_FLAG,
                                   0,
                                   GSS_C_NO_CHANNEL_BINDINGS,
                                   challenge.isEmpty() ? GSS_C_NO_BUFFER : &inBuf,
                                   nullptr,
                                   &outBuf,
                                   nullptr,
                                   nullptr);

    if (outBuf.length != 0)
        result = QByteArray(reinterpret_cast<const char*>(outBuf.value), outBuf.length);
    gss_release_buffer(&ignored, &outBuf);

    if (majStat != GSS_S_COMPLETE && majStat != GSS_S_CONTINUE_NEEDED) {
        q_GSSAPI_error("gss_init_sec_context error", majStat, minStat);
        gss_release_name(&ignored, &ctx->gssApiHandles->targetName);
        if (ctx->gssApiHandles->gssCtx)
            gss_delete_sec_context(&ignored, &ctx->gssApiHandles->gssCtx, GSS_C_NO_BUFFER);
        ctx->gssApiHandles.reset(nullptr);
    }

    if (majStat == GSS_S_COMPLETE) {
        gss_release_name(&ignored, &ctx->gssApiHandles->targetName);
        ctx->gssApiHandles.reset(nullptr);
    }

    return result;
}